

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

void __thiscall chrono::ChOptimizer::Eval_grad(ChOptimizer *this,double *x,double *gr)

{
  Scalar SVar1;
  double dVar2;
  uint uVar3;
  Scalar *pSVar4;
  int i;
  long lVar5;
  ulong uVar6;
  int i_1;
  double dVar7;
  ChVectorDynamic<> Vout;
  ChVectorDynamic<> Vin;
  Matrix<double,__1,_1,_0,__1,_1> local_58;
  Matrix<double,__1,_1,_0,__1,_1> local_48;
  double local_38;
  
  if (this->afunctionGrad == (ChFx *)0x0) {
    uVar3 = (*this->_vptr_ChOptimizer[7])(this);
    local_38 = Eval_fx(this,x);
    for (uVar6 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar6; uVar6 = uVar6 + 1) {
      dVar2 = x[uVar6];
      x[uVar6] = dVar2 + this->grad_step;
      dVar7 = Eval_fx(this,x);
      gr[uVar6] = (dVar7 - local_38) / this->grad_step;
      x[uVar6] = dVar2;
    }
  }
  else {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_48,&this->C_vars);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_58,&this->C_vars);
    for (lVar5 = 0;
        lVar5 < local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows; lVar5 = lVar5 + 1) {
      SVar1 = x[lVar5];
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,
                          lVar5);
      *pSVar4 = SVar1;
    }
    (*(code *)**(undefined8 **)this->afunctionGrad)(this->afunctionGrad,&local_58,&local_48);
    for (lVar5 = 0;
        lVar5 < local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows; lVar5 = lVar5 + 1) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_58,
                          lVar5);
      gr[lVar5] = *pSVar4;
    }
    Eigen::internal::handmade_aligned_free
              (local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free
              (local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
  }
  this->grad_evaluations = this->grad_evaluations + 1;
  return;
}

Assistant:

void ChOptimizer::Eval_grad(double x[], double gr[]) {
    if (afunctionGrad) {
        ChVectorDynamic<> Vin(C_vars);
        ChVectorDynamic<> Vout(C_vars);

        for (int i = 0; i < Vin.size(); i++)
            Vin(i) = x[i];
        afunctionGrad->Eval(Vout, Vin);
        for (int i = 0; i < Vout.size(); i++)
            gr[i] = Vout(i);
    } else {
        // otherwise use BDF
        int mtotvars = GetNumOfVars();
        double oldval;
        double mf, mfd;

        // Evaluate central value of function
        mf = Eval_fx(x);

        for (int mvar = 0; mvar < mtotvars; mvar++) {
            oldval = x[mvar];
            // increment one variable
            x[mvar] = oldval + grad_step;
            mfd = Eval_fx(x);
            // compute gradient by BDF
            gr[mvar] = ((mfd - mf) / (grad_step));
            // back to original value
            x[mvar] = oldval;
        }
    }
    grad_evaluations++;  // increment the counter of total number of gradient evaluations
}